

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::FileDescriptor::InternalDependenciesOnceInit(FileDescriptor *this)

{
  DescriptorPool *this_00;
  size_t sVar1;
  size_t sVar2;
  FileDescriptor *pFVar3;
  int i;
  long lVar4;
  char *name;
  once_flag *__s;
  string_view name_00;
  LogMessageFatal LStack_38;
  
  if (this->finished_building_ != false) {
    __s = this->dependencies_once_ + 1;
    for (lVar4 = 0; lVar4 < this->dependency_count_; lVar4 = lVar4 + 1) {
      sVar1 = strlen((char *)__s);
      if ((char)(__s->control_).super___atomic_base<unsigned_int>._M_i != '\0') {
        this_00 = this->pool_;
        sVar2 = strlen((char *)__s);
        name_00._M_str = (char *)__s;
        name_00._M_len = sVar2;
        pFVar3 = DescriptorPool::FindFileByName(this_00,name_00);
        this->dependencies_[lVar4] = pFVar3;
      }
      __s = (once_flag *)((long)&(__s->control_).super___atomic_base<unsigned_int>._M_i + sVar1 + 1)
      ;
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x28ce,"finished_building_ == true");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
}

Assistant:

void FileDescriptor::InternalDependenciesOnceInit() const {
  ABSL_CHECK(finished_building_ == true);
  const char* names_ptr = reinterpret_cast<const char*>(dependencies_once_ + 1);
  for (int i = 0; i < dependency_count(); i++) {
    const char* name = names_ptr;
    names_ptr += strlen(name) + 1;
    if (name[0] != '\0') {
      dependencies_[i] = pool_->FindFileByName(name);
    }
  }
}